

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3443::EvaluateSectionFrame
          (ChElementShellANCF_3443 *this,double xi,double eta,ChVector<double> *point,
          ChQuaternion<double> *rot)

{
  Matrix3xN *ebar;
  double thickness;
  double zoffset;
  ChVector<double> MidsurfaceY;
  ChMatrix33<double> msect;
  ChVector<double> MidsurfaceX;
  VectorN Sxi_eta_compact;
  VectorN Sxi_xi_compact;
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  int local_434;
  Matrix3xN *local_430;
  VectorN *local_428;
  ChVector<double> local_420;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_408;
  Matrix3xN *local_3e0;
  LhsNested local_3d8;
  ChVector<double> local_398;
  VectorN local_380;
  VectorN local_300;
  undefined1 local_280 [592];
  
  thickness = this->m_thicknessZ;
  zoffset = this->m_midsurfoffset;
  Calc_Sxi_compact(this,(VectorN *)local_280,xi,eta,0.0,thickness,zoffset);
  Calc_Sxi_xi_compact(this,&local_300,xi,eta,0.0,thickness,zoffset);
  Calc_Sxi_eta_compact(this,&local_380,xi,eta,0.0,thickness,zoffset);
  ebar = (Matrix3xN *)(local_280 + 0x80);
  CalcCoordMatrix(this,ebar);
  local_3e0 = ebar;
  local_3d8 = (LhsNested)local_280;
  ChVector<double>::operator=
            (point,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>_>
                    *)&local_3e0);
  local_430 = (Matrix3xN *)CONCAT44(local_430._4_4_,2);
  local_420.m_data[0] = (double)ebar;
  local_420.m_data[1] = (double)&local_300;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>>
  ::operator*(&local_408,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>>
               *)&local_420,(int *)&local_430);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_3e0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)&local_408,&this->m_lenX);
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_398,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_3e0,(type *)0x0);
  local_428 = &local_380;
  local_434 = 2;
  local_430 = ebar;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>>
  ::operator*(&local_408,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>>
               *)&local_430,&local_434);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_3e0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)&local_408,&this->m_lenY);
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_420,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_3e0,(type *)0x0);
  ChMatrix33<double>::Set_A_Xdir((ChMatrix33<double> *)&local_3e0,&local_398,&local_420);
  ChMatrix33<double>::Get_A_quaternion
            ((ChQuaternion<double> *)&local_408,(ChMatrix33<double> *)&local_3e0);
  ChQuaternion<double>::operator=(rot,(ChQuaternion<double> *)&local_408);
  return;
}

Assistant:

void ChElementShellANCF_3443::EvaluateSectionFrame(const double xi,
                                                   const double eta,
                                                   ChVector<>& point,
                                                   ChQuaternion<>& rot) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);
    VectorN Sxi_eta_compact;
    Calc_Sxi_eta_compact(Sxi_eta_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;

    // Since ANCF does not use rotations, calculate an approximate
    // rotation based off the position vector gradients
    ChVector<double> MidsurfaceX = e_bar * Sxi_xi_compact * 2 / m_lenX;
    ChVector<double> MidsurfaceY = e_bar * Sxi_eta_compact * 2 / m_lenY;

    // Since the position vector gradients are not in general orthogonal,
    // set the Dx direction tangent to the shell xi axis and
    // compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization, guided by the shell eta axis
    ChMatrix33<> msect;
    msect.Set_A_Xdir(MidsurfaceX, MidsurfaceY);

    rot = msect.Get_A_quaternion();
}